

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::anon_unknown_1::RegistryHub::~RegistryHub(RegistryHub *this)

{
  (this->super_IRegistryHub)._vptr_IRegistryHub = (_func_int **)&PTR__RegistryHub_00696cc0;
  (this->super_IMutableRegistryHub)._vptr_IMutableRegistryHub =
       (_func_int **)&PTR__RegistryHub_00696d40;
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__RegistryHub_00696d98;
  Detail::EnumValuesRegistry::~EnumValuesRegistry(&this->m_enumValuesRegistry);
  clara::std::
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  ::~vector(&(this->m_exceptionRegistry).m_exceptions);
  TagAliasRegistry::~TagAliasRegistry(&this->m_tagAliasRegistry);
  ExceptionTranslatorRegistry::~ExceptionTranslatorRegistry(&this->m_exceptionTranslatorRegistry);
  ReporterRegistry::~ReporterRegistry(&this->m_reporterRegistry);
  TestRegistry::~TestRegistry(&this->m_testCaseRegistry);
  return;
}

Assistant:

IReporterRegistry const &getReporterRegistry() const override { return m_reporterRegistry; }